

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_encoder.cc
# Opt level: O2

void __thiscall draco::RAnsBitEncoder::EncodeBit(RAnsBitEncoder *this,bool bit)

{
  pointer puVar1;
  uint32_t uVar2;
  undefined7 in_register_00000031;
  
  puVar1 = (this->bit_counts_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000031,bit) == 0) {
    *puVar1 = *puVar1 + 1;
    uVar2 = this->num_local_bits_;
  }
  else {
    puVar1[1] = puVar1[1] + 1;
    uVar2 = this->num_local_bits_;
    this->local_bits_ = this->local_bits_ | 1 << ((byte)uVar2 & 0x1f);
  }
  this->num_local_bits_ = uVar2 + 1;
  if (uVar2 + 1 == 0x20) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->bits_,&this->local_bits_);
    this->local_bits_ = 0;
    this->num_local_bits_ = 0;
  }
  return;
}

Assistant:

void RAnsBitEncoder::EncodeBit(bool bit) {
  if (bit) {
    bit_counts_[1]++;
    local_bits_ |= 1 << num_local_bits_;
  } else {
    bit_counts_[0]++;
  }
  num_local_bits_++;

  if (num_local_bits_ == 32) {
    bits_.push_back(local_bits_);
    num_local_bits_ = 0;
    local_bits_ = 0;
  }
}